

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_image_utils.cpp
# Opt level: O0

bool crnlib::image_utils::read_from_stream
               (image_u8 *dest,data_stream_serializer *serializer,uint read_flags)

{
  undefined1 uVar1;
  data_stream *pdVar2;
  uint in_EDX;
  data_stream_serializer *in_RSI;
  image_u8 *in_stack_00000010;
  data_stream_serializer *in_stack_00000018;
  dynamic_string ext;
  image_u8 *in_stack_00000050;
  data_stream_serializer *in_stack_00000058;
  dynamic_string *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb4;
  undefined1 in_stack_ffffffffffffffb5;
  undefined1 in_stack_ffffffffffffffb6;
  undefined1 in_stack_ffffffffffffffb7;
  bool local_1;
  
  if (in_EDX < 2) {
    pdVar2 = data_stream_serializer::get_stream(in_RSI);
    if (pdVar2 == (data_stream *)0x0) {
      local_1 = false;
    }
    else {
      data_stream_serializer::get_name
                ((data_stream_serializer *)
                 CONCAT17(in_stack_ffffffffffffffb7,
                          CONCAT16(in_stack_ffffffffffffffb6,
                                   CONCAT15(in_stack_ffffffffffffffb5,
                                            CONCAT14(in_stack_ffffffffffffffb4,
                                                     in_stack_ffffffffffffffb0)))));
      dynamic_string::dynamic_string
                ((dynamic_string *)
                 CONCAT17(in_stack_ffffffffffffffb7,
                          CONCAT16(in_stack_ffffffffffffffb6,
                                   CONCAT15(in_stack_ffffffffffffffb5,
                                            CONCAT14(in_stack_ffffffffffffffb4,
                                                     in_stack_ffffffffffffffb0)))),
                 in_stack_ffffffffffffffa8);
      file_utils::get_extension(in_stack_ffffffffffffffa8);
      uVar1 = dynamic_string::operator==
                        ((dynamic_string *)
                         CONCAT17(in_stack_ffffffffffffffb7,
                                  CONCAT16(in_stack_ffffffffffffffb6,
                                           CONCAT15(in_stack_ffffffffffffffb5,
                                                    CONCAT14(in_stack_ffffffffffffffb4,
                                                             in_stack_ffffffffffffffb0)))),
                         (char *)in_stack_ffffffffffffffa8);
      if ((((bool)uVar1) ||
          (in_stack_ffffffffffffffb6 =
                dynamic_string::operator==
                          ((dynamic_string *)
                           CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffffb6,
                                                   CONCAT15(in_stack_ffffffffffffffb5,
                                                            CONCAT14(in_stack_ffffffffffffffb4,
                                                                     in_stack_ffffffffffffffb0)))),
                           (char *)in_stack_ffffffffffffffa8), (bool)in_stack_ffffffffffffffb6)) &&
         ((in_EDX & 1) == 0)) {
        in_stack_ffffffffffffffb5 = read_from_stream_jpgd(in_stack_00000018,in_stack_00000010);
        local_1 = (bool)in_stack_ffffffffffffffb5;
      }
      else {
        in_stack_ffffffffffffffb4 = read_from_stream_stb(in_stack_00000058,in_stack_00000050);
        local_1 = (bool)in_stack_ffffffffffffffb4;
      }
      dynamic_string::~dynamic_string
                ((dynamic_string *)
                 CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffffb6,
                                         CONCAT15(in_stack_ffffffffffffffb5,
                                                  CONCAT14(in_stack_ffffffffffffffb4,
                                                           in_stack_ffffffffffffffb0)))));
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool read_from_stream(image_u8& dest, data_stream_serializer& serializer, uint read_flags) {
  if (read_flags > cReadFlagsAllFlags) {
    CRNLIB_ASSERT(0);
    return false;
  }

  if (!serializer.get_stream()) {
    CRNLIB_ASSERT(0);
    return false;
  }

  dynamic_string ext(serializer.get_name());
  file_utils::get_extension(ext);

  if ((ext == "jpg") || (ext == "jpeg")) {
    // Use my jpeg decoder by default because it supports progressive jpeg's.
    if ((read_flags & cReadFlagForceSTB) == 0) {
      return image_utils::read_from_stream_jpgd(serializer, dest);
    }
  }

  return image_utils::read_from_stream_stb(serializer, dest);
}